

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar b;
  uchar b_00;
  uchar b_01;
  uchar b_02;
  uchar b_03;
  uchar uVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  long lVar34;
  uchar *puVar35;
  uchar *puVar36;
  uchar uVar37;
  uchar *puVar38;
  uchar *puVar39;
  uchar *puVar40;
  uint uVar41;
  undefined1 auVar43 [16];
  uchar *local_b8;
  uchar *local_b0;
  long local_90;
  ulong uVar42;
  
  uVar25 = bpp + 7;
  uVar41 = uVar25 >> 3;
  uVar42 = (ulong)uVar41;
  lVar34 = (ulong)bpp * (ulong)(w >> 3);
  uVar30 = (ulong)((w & 7) * bpp + 7 >> 3);
  uVar1 = lVar34 + uVar30;
  lVar34 = lVar34 + uVar30 + 1;
  puVar39 = in + 1;
  local_90 = (long)out - uVar42;
  local_b0 = out + uVar42;
  local_b8 = in + uVar42 + 1;
  puVar35 = in + 3;
  puVar36 = in + 4;
  puVar40 = (uchar *)0x0;
  puVar38 = out;
  for (uVar30 = 0; uVar30 != h; uVar30 = uVar30 + 1) {
    switch(in[lVar34 * uVar30]) {
    case '\0':
      for (uVar26 = 0; uVar1 != uVar26; uVar26 = uVar26 + 1) {
        puVar38[uVar26] = puVar39[uVar26];
      }
      break;
    case '\x01':
      for (uVar26 = 0; uVar42 != uVar26; uVar26 = uVar26 + 1) {
        puVar38[uVar26] = puVar39[uVar26];
      }
      for (lVar27 = 0; (uVar42 - uVar1) + lVar27 != 0; lVar27 = lVar27 + 1) {
        puVar38[lVar27 + uVar42] = puVar38[lVar27] + puVar39[lVar27 + uVar42];
      }
      break;
    case '\x02':
      uVar26 = 0;
      if (puVar40 == (uchar *)0x0) {
        for (; uVar1 != uVar26; uVar26 = uVar26 + 1) {
          puVar38[uVar26] = puVar39[uVar26];
        }
      }
      else {
        for (; uVar1 != uVar26; uVar26 = uVar26 + 1) {
          puVar38[uVar26] = puVar40[uVar26] + puVar39[uVar26];
        }
      }
      break;
    case '\x03':
      uVar26 = 0;
      if (puVar40 == (uchar *)0x0) {
        for (; uVar42 != uVar26; uVar26 = uVar26 + 1) {
          puVar38[uVar26] = puVar39[uVar26];
        }
        for (lVar27 = 0; (uVar42 - uVar1) + lVar27 != 0; lVar27 = lVar27 + 1) {
          puVar38[lVar27 + uVar42] = (puVar38[lVar27] >> 1) + puVar39[lVar27 + uVar42];
        }
      }
      else {
        for (; uVar42 != uVar26; uVar26 = uVar26 + 1) {
          puVar38[uVar26] = (puVar40[uVar26] >> 1) + puVar39[uVar26];
        }
        if (uVar25 < 0x20) {
          if (uVar41 == 3) {
            for (uVar26 = 3; uVar26 + 2 < uVar1; uVar26 = uVar26 + 3) {
              bVar2 = puVar38[uVar26 - 2];
              bVar3 = puVar38[uVar26 - 1];
              bVar4 = puVar40[uVar26 + 1];
              bVar5 = puVar40[uVar26 + 2];
              uVar14 = puVar36[uVar26 - 2];
              uVar24 = puVar36[uVar26 - 1];
              puVar38[uVar26] =
                   (char)((uint)puVar40[uVar26] + (uint)puVar38[uVar26 - 3] >> 1) +
                   puVar36[uVar26 - 3];
              puVar38[uVar26 + 1] = (char)((uint)bVar4 + (uint)bVar2 >> 1) + uVar14;
              puVar38[uVar26 + 2] = (char)((uint)bVar5 + (uint)bVar3 >> 1) + uVar24;
            }
            lVar27 = uVar26 - 3;
          }
          else if (uVar25 < 0x10) {
            lVar27 = 0;
            uVar26 = uVar42;
          }
          else {
            for (uVar26 = 2; uVar26 + 1 < uVar1; uVar26 = uVar26 + 2) {
              bVar2 = puVar38[uVar26 - 1];
              bVar3 = puVar40[uVar26 + 1];
              uVar14 = puVar35[uVar26 - 1];
              puVar38[uVar26] =
                   (char)((uint)puVar40[uVar26] + (uint)puVar38[uVar26 - 2] >> 1) +
                   puVar35[uVar26 - 2];
              puVar38[uVar26 + 1] = (char)((uint)bVar3 + (uint)bVar2 >> 1) + uVar14;
            }
            lVar27 = uVar26 - 2;
          }
        }
        else {
          for (lVar27 = 0; uVar42 + lVar27 + 3 < uVar1; lVar27 = lVar27 + 4) {
            uVar10 = *(undefined4 *)(local_b8 + lVar27);
            uVar11 = *(uint *)(puVar40 + lVar27 + uVar42) & *(uint *)(puVar38 + lVar27);
            uVar12 = *(uint *)(puVar40 + lVar27 + uVar42) ^ *(uint *)(puVar38 + lVar27);
            auVar43 = ZEXT416(CONCAT22((ushort)(uVar12 >> 0x11),(ushort)uVar12 >> 1)) &
                      _DAT_0014aa90;
            *(uint *)(local_b0 + lVar27) =
                 CONCAT13(auVar43[3] + (char)(uVar11 >> 0x18) + (char)((uint)uVar10 >> 0x18),
                          CONCAT12(auVar43[2] +
                                   (char)(uVar11 >> 0x10) + (char)((uint)uVar10 >> 0x10),
                                   CONCAT11(auVar43[1] +
                                            (char)(uVar11 >> 8) + (char)((uint)uVar10 >> 8),
                                            auVar43[0] + (char)uVar11 + (char)uVar10)));
          }
          uVar26 = uVar42 + lVar27;
        }
        for (lVar29 = 0; uVar1 - uVar26 != lVar29; lVar29 = lVar29 + 1) {
          puVar38[lVar29 + uVar26] =
               (char)((uint)puVar40[lVar29 + uVar26] + (uint)puVar38[lVar29 + lVar27] >> 1) +
               puVar39[lVar29 + uVar26];
        }
      }
      break;
    case '\x04':
      if (puVar40 == (uchar *)0x0) {
        for (uVar26 = 0; uVar42 != uVar26; uVar26 = uVar26 + 1) {
          puVar38[uVar26] = puVar39[uVar26];
        }
        for (lVar27 = 0; uVar1 - uVar42 != lVar27; lVar27 = lVar27 + 1) {
          local_b0[lVar27] = puVar38[lVar27] + local_b8[lVar27];
        }
      }
      else {
        switch(uVar41) {
        case 1:
          uVar24 = '\0';
          uVar14 = '\0';
          for (uVar28 = 0; uVar26 = uVar1, uVar1 != uVar28; uVar28 = uVar28 + 1) {
            uVar15 = puVar40[uVar28];
            uVar16 = puVar39[uVar28];
            uVar24 = paethPredictor(uVar24,uVar15,uVar14);
            uVar24 = uVar24 + uVar16;
            puVar38[uVar28] = uVar24;
            uVar14 = uVar15;
          }
          break;
        case 2:
          uVar15 = '\0';
          uVar16 = '\0';
          uVar14 = '\0';
          uVar24 = '\0';
          for (uVar26 = 1; uVar26 < uVar1; uVar26 = uVar26 + 2) {
            uVar17 = puVar40[uVar26 - 1];
            uVar18 = puVar40[uVar26];
            uVar21 = puVar39[uVar26 - 1];
            uVar15 = paethPredictor(uVar15,uVar17,uVar14);
            uVar15 = uVar15 + uVar21;
            uVar14 = puVar39[uVar26];
            uVar16 = paethPredictor(uVar16,uVar18,uVar24);
            uVar16 = uVar16 + uVar14;
            puVar38[uVar26 - 1] = uVar15;
            puVar38[uVar26] = uVar16;
            uVar14 = uVar17;
            uVar24 = uVar18;
          }
          uVar26 = uVar26 - 1;
          break;
        case 3:
          uVar18 = '\0';
          uVar14 = '\0';
          uVar17 = '\0';
          uVar24 = '\0';
          uVar15 = '\0';
          uVar16 = '\0';
          for (uVar26 = 0; uVar26 + 2 < uVar1; uVar26 = uVar26 + 3) {
            uVar21 = puVar40[uVar26];
            uVar20 = puVar40[uVar26 + 1];
            uVar31 = puVar40[uVar26 + 2];
            uVar37 = puVar39[uVar26];
            uVar18 = paethPredictor(uVar18,uVar21,uVar24);
            uVar18 = uVar18 + uVar37;
            uVar24 = puVar39[uVar26 + 1];
            uVar14 = paethPredictor(uVar14,uVar20,uVar15);
            uVar14 = uVar14 + uVar24;
            uVar24 = puVar39[uVar26 + 2];
            uVar17 = paethPredictor(uVar17,uVar31,uVar16);
            uVar17 = uVar17 + uVar24;
            puVar38[uVar26] = uVar18;
            puVar38[uVar26 + 1] = uVar14;
            puVar38[uVar26 + 2] = uVar17;
            uVar24 = uVar21;
            uVar15 = uVar20;
            uVar16 = uVar31;
          }
          break;
        case 4:
          uVar20 = '\0';
          uVar14 = '\0';
          uVar24 = '\0';
          uVar21 = '\0';
          uVar15 = '\0';
          uVar16 = '\0';
          uVar17 = '\0';
          uVar18 = '\0';
          for (uVar26 = 3; uVar26 < uVar1; uVar26 = uVar26 + 4) {
            uVar31 = puVar40[uVar26 - 3];
            uVar37 = puVar40[uVar26 - 2];
            uVar23 = puVar40[uVar26 - 1];
            uVar22 = puVar40[uVar26];
            uVar33 = puVar39[uVar26 - 3];
            uVar20 = paethPredictor(uVar20,uVar31,uVar15);
            uVar20 = uVar20 + uVar33;
            uVar15 = puVar39[uVar26 - 2];
            uVar14 = paethPredictor(uVar14,uVar37,uVar16);
            uVar14 = uVar14 + uVar15;
            uVar15 = puVar39[uVar26 - 1];
            uVar24 = paethPredictor(uVar24,uVar23,uVar17);
            uVar24 = uVar24 + uVar15;
            uVar15 = puVar39[uVar26];
            uVar21 = paethPredictor(uVar21,uVar22,uVar18);
            uVar21 = uVar21 + uVar15;
            puVar38[uVar26 - 3] = uVar20;
            puVar38[uVar26 - 2] = uVar14;
            puVar38[uVar26 - 1] = uVar24;
            puVar38[uVar26] = uVar21;
            uVar15 = uVar31;
            uVar16 = uVar37;
            uVar17 = uVar23;
            uVar18 = uVar22;
          }
          uVar26 = uVar26 - 3;
          break;
        default:
          for (uVar28 = 0; uVar26 = uVar42, uVar42 != uVar28; uVar28 = uVar28 + 1) {
            puVar38[uVar28] = puVar40[uVar28] + puVar39[uVar28];
          }
          break;
        case 6:
          uVar24 = '\0';
          uVar14 = '\0';
          uVar15 = '\0';
          uVar22 = '\0';
          uVar16 = '\0';
          uVar23 = '\0';
          uVar17 = '\0';
          uVar18 = '\0';
          uVar21 = '\0';
          uVar20 = '\0';
          uVar31 = '\0';
          uVar37 = '\0';
          for (uVar26 = 5; uVar26 < uVar1; uVar26 = uVar26 + 6) {
            uVar33 = puVar40[uVar26 - 5];
            uVar32 = puVar40[uVar26 - 4];
            uVar19 = puVar40[uVar26 - 3];
            uVar13 = puVar40[uVar26 - 2];
            uVar6 = puVar40[uVar26 - 1];
            uVar7 = puVar40[uVar26];
            uVar8 = puVar39[uVar26 - 5];
            uVar22 = paethPredictor(uVar22,uVar33,uVar17);
            uVar22 = uVar22 + uVar8;
            uVar17 = puVar39[uVar26 - 4];
            uVar14 = paethPredictor(uVar14,uVar32,uVar18);
            uVar14 = uVar14 + uVar17;
            uVar17 = puVar39[uVar26 - 3];
            uVar24 = paethPredictor(uVar24,uVar19,uVar21);
            uVar24 = uVar24 + uVar17;
            uVar17 = puVar39[uVar26 - 2];
            uVar15 = paethPredictor(uVar15,uVar13,uVar20);
            uVar15 = uVar15 + uVar17;
            uVar17 = puVar39[uVar26 - 1];
            uVar16 = paethPredictor(uVar16,uVar6,uVar31);
            uVar16 = uVar16 + uVar17;
            uVar17 = puVar39[uVar26];
            uVar23 = paethPredictor(uVar23,uVar7,uVar37);
            uVar23 = uVar23 + uVar17;
            puVar38[uVar26 - 5] = uVar22;
            puVar38[uVar26 - 4] = uVar14;
            puVar38[uVar26 - 3] = uVar24;
            puVar38[uVar26 - 2] = uVar15;
            puVar38[uVar26 - 1] = uVar16;
            puVar38[uVar26] = uVar23;
            uVar17 = uVar33;
            uVar18 = uVar32;
            uVar21 = uVar19;
            uVar20 = uVar13;
            uVar31 = uVar6;
            uVar37 = uVar7;
          }
          uVar26 = uVar26 - 5;
          break;
        case 8:
          uVar19 = '\0';
          uVar18 = '\0';
          uVar17 = '\0';
          uVar16 = '\0';
          uVar15 = '\0';
          uVar24 = '\0';
          uVar14 = '\0';
          uVar13 = '\0';
          uVar21 = '\0';
          uVar20 = '\0';
          uVar31 = '\0';
          uVar37 = '\0';
          uVar23 = '\0';
          uVar22 = '\0';
          uVar33 = '\0';
          uVar32 = '\0';
          for (uVar26 = 7; uVar26 < uVar1; uVar26 = uVar26 + 8) {
            uVar6 = puVar40[uVar26 - 7];
            uVar7 = puVar40[uVar26 - 6];
            uVar8 = puVar40[uVar26 - 5];
            b = puVar40[uVar26 - 4];
            b_00 = puVar40[uVar26 - 3];
            b_01 = puVar40[uVar26 - 2];
            b_02 = puVar40[uVar26 - 1];
            b_03 = puVar40[uVar26];
            uVar9 = puVar39[uVar26 - 7];
            uVar13 = paethPredictor(uVar13,uVar6,uVar21);
            uVar13 = uVar13 + uVar9;
            uVar21 = puVar39[uVar26 - 6];
            uVar14 = paethPredictor(uVar14,uVar7,uVar20);
            uVar14 = uVar14 + uVar21;
            uVar21 = puVar39[uVar26 - 5];
            uVar24 = paethPredictor(uVar24,uVar8,uVar31);
            uVar24 = uVar24 + uVar21;
            uVar21 = puVar39[uVar26 - 4];
            uVar15 = paethPredictor(uVar15,b,uVar37);
            uVar15 = uVar15 + uVar21;
            uVar21 = puVar39[uVar26 - 3];
            uVar16 = paethPredictor(uVar16,b_00,uVar23);
            uVar16 = uVar16 + uVar21;
            uVar21 = puVar39[uVar26 - 2];
            uVar17 = paethPredictor(uVar17,b_01,uVar22);
            uVar17 = uVar17 + uVar21;
            uVar21 = puVar39[uVar26 - 1];
            uVar18 = paethPredictor(uVar18,b_02,uVar33);
            uVar18 = uVar18 + uVar21;
            uVar21 = puVar39[uVar26];
            uVar19 = paethPredictor(uVar19,b_03,uVar32);
            uVar19 = uVar19 + uVar21;
            puVar38[uVar26 - 7] = uVar13;
            puVar38[uVar26 - 6] = uVar14;
            puVar38[uVar26 - 5] = uVar24;
            puVar38[uVar26 - 4] = uVar15;
            puVar38[uVar26 - 3] = uVar16;
            puVar38[uVar26 - 2] = uVar17;
            puVar38[uVar26 - 1] = uVar18;
            puVar38[uVar26] = uVar19;
            uVar21 = uVar6;
            uVar20 = uVar7;
            uVar31 = uVar8;
            uVar37 = b;
            uVar23 = b_00;
            uVar22 = b_01;
            uVar33 = b_02;
            uVar32 = b_03;
          }
          uVar26 = uVar26 - 7;
        }
        for (; uVar1 != uVar26; uVar26 = uVar26 + 1) {
          uVar14 = puVar39[uVar26];
          uVar24 = paethPredictor(*(uchar *)(local_90 + uVar26),puVar40[uVar26],
                                  puVar40[uVar26 - uVar42]);
          puVar38[uVar26] = uVar24 + uVar14;
        }
      }
      break;
    default:
      return 0x24;
    }
    puVar40 = out + uVar1 * uVar30;
    puVar38 = puVar38 + uVar1;
    puVar39 = puVar39 + lVar34;
    local_90 = local_90 + uVar1;
    local_b0 = local_b0 + uVar1;
    local_b8 = local_b8 + lVar34;
    puVar35 = puVar35 + lVar34;
    puVar36 = puVar36 + lVar34;
  }
  return 0;
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  for(y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}